

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum_set.h
# Opt level: O1

size_t __thiscall
spvtools::EnumSet<spvtools::Extension>::erase(EnumSet<spvtools::Extension> *this,Extension *value)

{
  pointer __src;
  pointer *ppBVar1;
  Extension EVar2;
  pointer pBVar3;
  size_t sVar4;
  ulong uVar5;
  pointer pBVar6;
  
  sVar4 = FindBucketForValue(this,*value);
  pBVar6 = (this->buckets_).
           super__Vector_base<spvtools::EnumSet<spvtools::Extension>::Bucket,_std::allocator<spvtools::EnumSet<spvtools::Extension>::Bucket>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pBVar3 = (this->buckets_).
           super__Vector_base<spvtools::EnumSet<spvtools::Extension>::Bucket,_std::allocator<spvtools::EnumSet<spvtools::Extension>::Bucket>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (sVar4 < (ulong)((long)pBVar3 - (long)pBVar6 >> 4)) {
    EVar2 = *value;
    if (pBVar6[sVar4].start == (EVar2 & ~kSPV_INTEL_kernel_attributes)) {
      pBVar6 = pBVar6 + sVar4;
      uVar5 = pBVar6->data;
      if ((uVar5 >> ((ulong)EVar2 & 0x3f) & 1) != 0) {
        this->size_ = this->size_ - 1;
        uVar5 = uVar5 & ~(1L << ((byte)EVar2 & 0x3f));
        pBVar6->data = uVar5;
        if (uVar5 != 0) {
          return 1;
        }
        __src = pBVar6 + 1;
        if (__src != pBVar3) {
          memmove(pBVar6,__src,(long)pBVar3 - (long)__src);
        }
        ppBVar1 = &(this->buckets_).
                   super__Vector_base<spvtools::EnumSet<spvtools::Extension>::Bucket,_std::allocator<spvtools::EnumSet<spvtools::Extension>::Bucket>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppBVar1 = *ppBVar1 + -1;
        return 1;
      }
    }
  }
  return 0;
}

Assistant:

size_t erase(const T& value) {
    const size_t index = FindBucketForValue(value);
    if (index >= buckets_.size() ||
        buckets_[index].start != ComputeBucketStart(value)) {
      return 0;
    }

    auto& bucket = buckets_[index];
    const auto mask = ComputeMaskForValue(value);
    if (!(bucket.data & mask)) {
      return 0;
    }

    size_ -= 1;
    bucket.data &= ~mask;
    if (bucket.data == 0) {
      buckets_.erase(buckets_.cbegin() + index);
    }
    return 1;
  }